

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search.c
# Opt level: O2

int32 ngram_search_exit_score(ngram_search_t *ngs,bptbl_t *pbe,int rcphone)

{
  int32 *piVar1;
  
  if ((long)pbe->last2_phone == -1) {
    piVar1 = &pbe->score;
  }
  else {
    piVar1 = ngs->bscore_stack +
             (long)((ngs->base).d2p)->rssid[pbe->last_phone][pbe->last2_phone].cimap[rcphone] +
             (long)pbe->s_idx;
  }
  return *piVar1;
}

Assistant:

int32
ngram_search_exit_score(ngram_search_t *ngs, bptbl_t *pbe, int rcphone)
{
    /* DICT2PID */
    /* Get the mapping from right context phone ID to index in the
     * right context table and the bscore_stack. */
    if (pbe->last2_phone == -1) {
        /* No right context for single phone predecessor words. */
        return pbe->score;
    }
    else {
        xwdssid_t *rssid;
        /* Find the index for the last diphone of the previous word +
         * the first phone of the current word. */
        rssid = dict2pid_rssid(ps_search_dict2pid(ngs),
                               pbe->last_phone, pbe->last2_phone);
        /* This may be WORST_SCORE, which means that there was no exit
         * with rcphone as right context. */
        return ngs->bscore_stack[pbe->s_idx + rssid->cimap[rcphone]];
    }
}